

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::decodeObject
          (JsonCodec *this,Reader input,StructSchema type,Orphanage orphanage,Builder output)

{
  uint *__return_storage_ptr__;
  int *__return_storage_ptr___00;
  Field fieldSchema_00;
  Reader fieldValue;
  Orphanage orphanage_00;
  bool bVar1;
  NullableValue<capnp::StructSchema::Field> *other;
  Field *pFVar2;
  Iterator IVar3;
  Reader local_208;
  RawBrandedSchema *local_1d8;
  undefined8 uStack_1d0;
  SegmentReader *local_1c8;
  CapTableReader *pCStack_1c0;
  void *local_1b8;
  WirePointer *pWStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  ArrayPtr<const_char> local_198;
  char *local_188;
  size_t sStack_180;
  Maybe<capnp::StructSchema::Field> local_178;
  undefined1 local_130 [8];
  NullableValue<capnp::StructSchema::Field> fieldSchema;
  Reader field;
  undefined1 local_a8 [8];
  Iterator __end1;
  undefined1 local_88 [8];
  Iterator __begin1;
  Reader *__range1;
  Fault local_30;
  Fault f;
  JsonCodec *this_local;
  Orphanage orphanage_local;
  StructSchema type_local;
  
  orphanage_local.arena = (BuilderArena *)orphanage.capTable;
  f.exception = (Exception *)this;
  orphanage_local.capTable = (CapTableBuilder *)type.super_Schema.raw;
  bVar1 = capnp::json::Value::Reader::isObject(&input);
  if (bVar1) {
    __return_storage_ptr__ = &__begin1.index;
    capnp::json::Value::Reader::getObject((Reader *)__return_storage_ptr__,&input);
    IVar3 = List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader::begin
                      ((Reader *)__return_storage_ptr__);
    __end1._8_8_ = IVar3.container;
    __begin1.container._0_4_ = IVar3.index;
    local_88 = (undefined1  [8])__end1._8_8_;
    IVar3 = List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader::end
                      ((Reader *)__return_storage_ptr__);
    local_a8 = (undefined1  [8])IVar3.container;
    __end1.container._0_4_ = IVar3.index;
    while (bVar1 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                   ::operator!=((IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                                 *)local_88,
                                (IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                                 *)local_a8), bVar1) {
      __return_storage_ptr___00 = &fieldSchema.field_1.value.proto._reader.nestingLimit;
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
      ::operator*((Reader *)__return_storage_ptr___00,
                  (IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                   *)local_88);
      local_198 = (ArrayPtr<const_char>)
                  capnp::json::Value::Field::Reader::getName((Reader *)__return_storage_ptr___00);
      local_188 = local_198.ptr;
      sStack_180 = local_198.size_;
      StructSchema::findFieldByName
                (&local_178,(StructSchema *)&orphanage_local.capTable,(StringPtr)local_198);
      other = kj::_::readMaybe<capnp::StructSchema::Field>(&local_178);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_130,other);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_178);
      pFVar2 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_130);
      if (pFVar2 != (Field *)0x0) {
        pFVar2 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                           ((NullableValue<capnp::StructSchema::Field> *)local_130);
        local_1d8 = (pFVar2->parent).super_Schema.raw;
        uStack_1d0 = *(undefined8 *)&pFVar2->index;
        local_1c8 = (pFVar2->proto)._reader.segment;
        pCStack_1c0 = (pFVar2->proto)._reader.capTable;
        local_1b8 = (pFVar2->proto)._reader.data;
        pWStack_1b0 = (pFVar2->proto)._reader.pointers;
        local_1a8._0_4_ = (pFVar2->proto)._reader.dataSize;
        local_1a8._4_2_ = (pFVar2->proto)._reader.pointerCount;
        local_1a8._6_2_ = *(undefined2 *)&(pFVar2->proto)._reader.field_0x26;
        uStack_1a0 = *(undefined8 *)&(pFVar2->proto)._reader.nestingLimit;
        capnp::json::Value::Field::Reader::getValue
                  (&local_208,(Reader *)&fieldSchema.field_1.value.proto._reader.nestingLimit);
        orphanage_00.capTable = (CapTableBuilder *)orphanage_local.arena;
        orphanage_00.arena = orphanage.arena;
        fieldSchema_00._8_8_ = uStack_1d0;
        fieldSchema_00.parent.super_Schema.raw = (Schema)(Schema)local_1d8;
        fieldSchema_00.proto._reader.segment = local_1c8;
        fieldSchema_00.proto._reader.capTable = pCStack_1c0;
        fieldSchema_00.proto._reader.data = local_1b8;
        fieldSchema_00.proto._reader.pointers = pWStack_1b0;
        fieldSchema_00.proto._reader.dataSize = (undefined4)local_1a8;
        fieldSchema_00.proto._reader.pointerCount = local_1a8._4_2_;
        fieldSchema_00.proto._reader._38_2_ = local_1a8._6_2_;
        fieldSchema_00.proto._reader._40_8_ = uStack_1a0;
        fieldValue._reader.capTable = local_208._reader.capTable;
        fieldValue._reader.segment = local_208._reader.segment;
        fieldValue._reader.data = local_208._reader.data;
        fieldValue._reader.pointers = local_208._reader.pointers;
        fieldValue._reader.dataSize = local_208._reader.dataSize;
        fieldValue._reader.pointerCount = local_208._reader.pointerCount;
        fieldValue._reader._38_2_ = local_208._reader._38_2_;
        fieldValue._reader.nestingLimit = local_208._reader.nestingLimit;
        fieldValue._reader._44_4_ = local_208._reader._44_4_;
        decodeField(this,fieldSchema_00,fieldValue,orphanage_00,output);
      }
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_130);
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                    *)local_88);
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x180,FAILED,"input.isObject()","\"Expected object value\"",
               (char (*) [22])"Expected object value");
    kj::_::Debug::Fault::~Fault(&local_30);
  }
  return;
}

Assistant:

void JsonCodec::decodeObject(JsonValue::Reader input, StructSchema type, Orphanage orphanage, DynamicStruct::Builder output) const {
  KJ_REQUIRE(input.isObject(), "Expected object value") { return; }
  for (auto field: input.getObject()) {
    KJ_IF_MAYBE(fieldSchema, type.findFieldByName(field.getName())) {
      decodeField(*fieldSchema, field.getValue(), orphanage, output);
    } else {
      // Unknown json fields are ignored to allow schema evolution
    }
  }
}